

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

cmServerResponse * __thiscall
cmServerProtocol1::Process
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  size_t __n;
  __type _Var1;
  int iVar2;
  string local_40;
  
  if ((int)this->m_State < 1) {
    __assert_fail("this->m_State >= STATE_ACTIVE",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx"
                  ,0x1c6,
                  "virtual const cmServerResponse cmServerProtocol1::Process(const cmServerRequest &)"
                 );
  }
  __n = (request->Type)._M_string_length;
  if ((__n == kCACHE_TYPE_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((request->Type)._M_dataplus._M_p,kCACHE_TYPE_abi_cxx11_._M_dataplus._M_p,__n),
      iVar2 == 0)))) {
    ProcessCache(__return_storage_ptr__,this,request);
    return __return_storage_ptr__;
  }
  if ((__n == kCMAKE_INPUTS_TYPE_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((request->Type)._M_dataplus._M_p,kCMAKE_INPUTS_TYPE_abi_cxx11_._M_dataplus._M_p,
                    __n), iVar2 == 0)))) {
    ProcessCMakeInputs(__return_storage_ptr__,this,request);
    return __return_storage_ptr__;
  }
  if ((__n == kCODE_MODEL_TYPE_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((request->Type)._M_dataplus._M_p,kCODE_MODEL_TYPE_abi_cxx11_._M_dataplus._M_p,
                    __n), iVar2 == 0)))) {
    ProcessCodeModel(__return_storage_ptr__,this,request);
    return __return_storage_ptr__;
  }
  if ((__n == kCOMPUTE_TYPE_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((request->Type)._M_dataplus._M_p,kCOMPUTE_TYPE_abi_cxx11_._M_dataplus._M_p,__n),
      iVar2 == 0)))) {
    ProcessCompute(__return_storage_ptr__,this,request);
    return __return_storage_ptr__;
  }
  if ((__n == kCONFIGURE_TYPE_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((request->Type)._M_dataplus._M_p,kCONFIGURE_TYPE_abi_cxx11_._M_dataplus._M_p,__n
                   ), iVar2 == 0)))) {
    ProcessConfigure(__return_storage_ptr__,this,request);
    return __return_storage_ptr__;
  }
  if ((__n == kFILESYSTEM_WATCHERS_TYPE_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((request->Type)._M_dataplus._M_p,
                    kFILESYSTEM_WATCHERS_TYPE_abi_cxx11_._M_dataplus._M_p,__n), iVar2 == 0)))) {
    ProcessFileSystemWatchers(__return_storage_ptr__,this,request);
  }
  else {
    _Var1 = std::operator==(&request->Type,&kGLOBAL_SETTINGS_TYPE_abi_cxx11_);
    if (_Var1) {
      ProcessGlobalSettings(__return_storage_ptr__,this,request);
    }
    else {
      _Var1 = std::operator==(&request->Type,&kSET_GLOBAL_SETTINGS_TYPE_abi_cxx11_);
      if (_Var1) {
        ProcessSetGlobalSettings(__return_storage_ptr__,this,request);
      }
      else {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Unknown command!","");
        cmServerRequest::ReportError(__return_storage_ptr__,request,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const cmServerResponse cmServerProtocol1::Process(
  const cmServerRequest& request)
{
  assert(this->m_State >= STATE_ACTIVE);

  if (request.Type == kCACHE_TYPE) {
    return this->ProcessCache(request);
  }
  if (request.Type == kCMAKE_INPUTS_TYPE) {
    return this->ProcessCMakeInputs(request);
  }
  if (request.Type == kCODE_MODEL_TYPE) {
    return this->ProcessCodeModel(request);
  }
  if (request.Type == kCOMPUTE_TYPE) {
    return this->ProcessCompute(request);
  }
  if (request.Type == kCONFIGURE_TYPE) {
    return this->ProcessConfigure(request);
  }
  if (request.Type == kFILESYSTEM_WATCHERS_TYPE) {
    return this->ProcessFileSystemWatchers(request);
  }
  if (request.Type == kGLOBAL_SETTINGS_TYPE) {
    return this->ProcessGlobalSettings(request);
  }
  if (request.Type == kSET_GLOBAL_SETTINGS_TYPE) {
    return this->ProcessSetGlobalSettings(request);
  }

  return request.ReportError("Unknown command!");
}